

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
* __thiscall
llvm::optional_detail::
OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::operator=(OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  if (this->hasVal == true) {
    this_00 = getPointer(this);
    std::__cxx11::string::operator=((string *)this_00,(string *)y);
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)y);
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasVal)
      *getPointer() = std::move(y);
    else {
      new (storage.buffer) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }